

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodebuild.cpp
# Opt level: O3

bool __thiscall
FNodeBuilder::CheckSubsectorOverlappingSegs
          (FNodeBuilder *this,DWORD set,node_t *node,DWORD *splitseg)

{
  FPrivSeg *pFVar1;
  uint uVar2;
  FPrivSeg *pFVar3;
  bool bVar4;
  uint uVar5;
  DWORD mate;
  
  if (set != 0xffffffff) {
    pFVar3 = (this->Segs).Array;
    mate = set;
    do {
      pFVar1 = pFVar3 + mate;
      if (pFVar1->linedef == -1) {
        uVar5 = pFVar1->next;
      }
      else {
        uVar5 = pFVar3[mate].next;
        if (uVar5 == 0xffffffff) {
          return false;
        }
        uVar2 = uVar5;
        do {
          if ((pFVar3[uVar2].v1 == pFVar1->v1) && (pFVar3[uVar2].v2 == pFVar1->v2)) {
            uVar5 = uVar2;
            if (pFVar3[uVar2].linedef == -1) {
              uVar5 = mate;
              mate = uVar2;
            }
            *splitseg = 0xffffffff;
            bVar4 = ShoveSegBehind(this,set,node,uVar5,mate);
            return bVar4;
          }
          uVar2 = pFVar3[uVar2].next;
        } while (uVar2 != 0xffffffff);
      }
      mate = uVar5;
    } while (mate != 0xffffffff);
  }
  return false;
}

Assistant:

bool FNodeBuilder::CheckSubsectorOverlappingSegs (DWORD set, node_t &node, DWORD &splitseg)
{
	int v1, v2;
	DWORD seg1, seg2;

	for (seg1 = set; seg1 != DWORD_MAX; seg1 = Segs[seg1].next)
	{
		if (Segs[seg1].linedef == -1)
		{ // Do not check minisegs.
			continue;
		}
		v1 = Segs[seg1].v1;
		v2 = Segs[seg1].v2;
		for (seg2 = Segs[seg1].next; seg2 != DWORD_MAX; seg2 = Segs[seg2].next)
		{
			if (Segs[seg2].v1 == v1 && Segs[seg2].v2 == v2)
			{
				if (Segs[seg2].linedef == -1)
				{ // Do not put minisegs into a new subsector.
					swapvalues (seg1, seg2);
				}
				D(Printf(PRINT_LOG, "Need to synthesize a splitter for set %d on seg %d (ov)\n", set, seg2));
				splitseg = DWORD_MAX;

				return ShoveSegBehind (set, node, seg2, seg1);
			}
		}
	}
	// It really is a good subsector.
	return false;
}